

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O0

id_type __thiscall Darts::Details::DawgBuilder::hash_unit(DawgBuilder *this,id_type id)

{
  bool bVar1;
  id_type iVar2;
  DawgUnit *pDVar3;
  byte *pbVar4;
  int in_ESI;
  AutoPool<Darts::Details::DawgUnit> *in_RDI;
  uchar_type label;
  id_type unit;
  id_type hash_value;
  size_t in_stack_ffffffffffffffd8;
  uint local_10;
  int local_c;
  
  local_10 = 0;
  local_c = in_ESI;
  while( true ) {
    if (local_c == 0) {
      return local_10;
    }
    pDVar3 = AutoPool<Darts::Details::DawgUnit>::operator[](in_RDI,in_stack_ffffffffffffffd8);
    iVar2 = DawgUnit::unit(pDVar3);
    pbVar4 = AutoPool<unsigned_char>::operator[]
                       ((AutoPool<unsigned_char> *)in_RDI,in_stack_ffffffffffffffd8);
    iVar2 = hash((uint)*pbVar4 << 0x18 ^ iVar2);
    local_10 = iVar2 ^ local_10;
    pDVar3 = AutoPool<Darts::Details::DawgUnit>::operator[](in_RDI,in_stack_ffffffffffffffd8);
    bVar1 = DawgUnit::has_sibling(pDVar3);
    if (!bVar1) break;
    local_c = local_c + 1;
  }
  return local_10;
}

Assistant:

inline id_type DawgBuilder::hash_unit(id_type id) const {
  id_type hash_value = 0;
  for ( ; id != 0; ++id) {
    id_type unit = units_[id].unit();
    uchar_type label = labels_[id];
    hash_value ^= hash((label << 24) ^ unit);

    if (units_[id].has_sibling() == false) {
      break;
    }
  }
  return hash_value;
}